

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncTimeCoordinator.cpp
# Opt level: O2

MessageProcessingResult __thiscall
helics::AsyncTimeCoordinator::checkExecEntry(AsyncTimeCoordinator *this,GlobalFederateId param_1)

{
  ActionMessage execgrant;
  
  (this->super_BaseTimeCoordinator).executionMode = true;
  (this->currentMinTime).internalTimeCode = 0;
  this->currentTimeState = time_granted;
  (this->nextEvent).internalTimeCode = 0;
  ActionMessage::ActionMessage(&execgrant,cmd_exec_grant);
  execgrant.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
  transmitTimingMessagesDownstream(this,&execgrant,(GlobalFederateId)0x8831d580);
  transmitTimingMessagesUpstream(this,&execgrant);
  ActionMessage::~ActionMessage(&execgrant);
  return NEXT_STEP;
}

Assistant:

MessageProcessingResult AsyncTimeCoordinator::checkExecEntry(GlobalFederateId /*triggerFed*/)
{
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;

    executionMode = true;
    ret = MessageProcessingResult::NEXT_STEP;

    currentMinTime = timeZero;
    currentTimeState = TimeState::time_granted;
    nextEvent = timeZero;

    ActionMessage execgrant(CMD_EXEC_GRANT);
    execgrant.source_id = mSourceId;
    transmitTimingMessagesDownstream(execgrant);
    transmitTimingMessagesUpstream(execgrant);
    return ret;
}